

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

char * __thiscall QMetaProperty::typeName(QMetaProperty *this)

{
  bool bVar1;
  QMetaProperty *in_RDI;
  long in_FS_OFFSET;
  QMetaType mt;
  undefined8 in_stack_ffffffffffffffb0;
  uint typeInfo;
  QMetaObject *mo;
  char *local_28;
  QMetaType local_10;
  long local_8;
  
  typeInfo = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->mobj == (QMetaObject *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_10.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = metaType(in_RDI);
    bVar1 = QMetaType::isValid(&local_10);
    if (bVar1) {
      local_28 = QMetaType::name(&local_10);
    }
    else {
      mo = in_RDI->mobj;
      Data::type(&in_RDI->data);
      typeNameFromTypeInfo(mo,typeInfo);
      local_28 = QByteArrayView::constData((QByteArrayView *)0x3663b8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

const char *QMetaProperty::typeName() const
{
    if (!mobj)
        return nullptr;
    // TODO: can the metatype be invalid for dynamic metaobjects?
    if (const auto mt = metaType(); mt.isValid())
        return mt.name();
    return typeNameFromTypeInfo(mobj, data.type()).constData();
}